

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O0

void __thiscall
QBluetoothPermission::setCommunicationModes(QBluetoothPermission *this,CommunicationModes modes)

{
  bool bVar1;
  Int IVar2;
  QFlagsStorage<QBluetoothPermission::CommunicationMode> in_ESI;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *this_00;
  char *in_stack_ffffffffffffffb8;
  QMessageLogger *in_stack_ffffffffffffffc0;
  QFlagsStorage<QBluetoothPermission::CommunicationMode> local_24;
  QFlagsStorage<QBluetoothPermission::CommunicationMode> local_20;
  QFlags<QBluetoothPermission::CommunicationMode> local_1c;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  local_20.i = in_ESI.i;
  memset(&local_24,0,4);
  QFlags<QBluetoothPermission::CommunicationMode>::QFlags
            ((QFlags<QBluetoothPermission::CommunicationMode> *)0x91490b);
  bVar1 = ::operator==((QFlags<QBluetoothPermission::CommunicationMode>)local_20.i,
                       (QFlags<QBluetoothPermission::CommunicationMode>)local_24.i);
  if (bVar1) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcPermissions();
    anon_unknown.dwarf_161020b::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder((QLoggingCategoryMacroHolder<(QtMsgType)1> *)this_00,in_RDI);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_18);
      if (!bVar1) break;
      anon_unknown.dwarf_161020b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x914962);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int)((ulong)this_00 >> 0x20),
                 (char *)in_RDI,(char *)0x914978);
      QMessageLogger::warning
                ((QMessageLogger *)&stack0xffffffffffffffb8,
                 "QBluetoothPermission: trying to set an invalid empty mode. Falling back to CommunicationMode::Default."
                );
      local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
    }
    *(undefined1 *)&in_RDI->d = 3;
  }
  else {
    IVar2 = QFlags<QBluetoothPermission::CommunicationMode>::toInt(&local_1c);
    *(char *)&in_RDI->d = (char)IVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QBluetoothPermission::setCommunicationModes(CommunicationModes modes)
{
    if (modes == CommunicationModes{}) {
        qCWarning(lcPermissions, "QBluetoothPermission: trying to set an invalid empty mode. "
                                 "Falling back to CommunicationMode::Default.");
        u.data.mode = Default;
    } else {
        u.data.mode = static_cast<CommunicationMode>(modes.toInt());
    }
}